

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall QPrintPreviewDialogPrivate::_q_pageNumEdited(QPrintPreviewDialogPrivate *this)

{
  long lVar1;
  bool *in_RDI;
  long in_FS_OFFSET;
  int res;
  bool ok;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text();
  QString::toInt((QString *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI,
                 in_stack_ffffffffffffffbc);
  QString::~QString((QString *)0x17e7cd);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintPreviewDialogPrivate::_q_pageNumEdited()
{
    bool ok = false;
    int res = pageNumEdit->text().toInt(&ok);
    if (ok)
        preview->setCurrentPage(res);
}